

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O2

string * __thiscall
sqlcheck::GetBooleanString_abi_cxx11_(string *__return_storage_ptr__,sqlcheck *this,bool *status)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_a;
  allocator local_9;
  
  if (*this == (sqlcheck)0x1) {
    pcVar2 = "ENABLED";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "DISABLED";
    paVar1 = &local_a;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string GetBooleanString(const bool& status){
  if(status == true){
    return "ENABLED";
  }
  else {
    return "DISABLED";
  }
}